

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseFunctionStmt(Parser *this,bool mustParseBody)

{
  line_t *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  _func_int **pp_Var8;
  undefined8 *puVar9;
  undefined4 in_EDX;
  _Head_base<0UL,_enact::Stmt_*,_false> _Var10;
  undefined7 in_register_00000031;
  Parser *this_00;
  char cVar11;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> returnTypename;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> body;
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> params;
  Token name;
  undefined1 local_e8 [8];
  _Alloc_hider _Stack_e0;
  undefined1 local_d8 [24];
  line_t local_c0;
  col_t local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> local_88;
  char local_6c;
  TokenType local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  line_t local_40;
  col_t local_3c;
  _Head_base<0UL,_enact::Stmt_*,_false> local_38;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,mustParseBody);
  local_e8 = (undefined1  [8])local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Expected function name.","");
  expect(this_00,IDENTIFIER,(string *)local_e8);
  if (local_e8 != (undefined1  [8])local_d8) {
    operator_delete((void *)local_e8,local_d8._0_8_ + 1);
  }
  local_68 = (this_00->m_previous).type;
  local_60._M_allocated_capacity = (size_type)&local_50;
  pcVar3 = (this_00->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + (this_00->m_previous).lexeme._M_string_length);
  local_3c = (this_00->m_previous).col;
  local_40 = (this_00->m_previous).line;
  local_e8 = (undefined1  [8])local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,"Expected \'(\' after function name.","");
  expect(this_00,LEFT_PAREN,(string *)local_e8);
  local_38._M_head_impl = (Stmt *)this;
  if (local_e8 != (undefined1  [8])local_d8) {
    operator_delete((void *)local_e8,local_d8._0_8_ + 1);
  }
  plVar1 = &(this_00->m_previous).line;
  local_88.
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this_00->m_current).type == RIGHT_PAREN) {
    advance(this_00);
    cVar11 = (char)in_EDX;
  }
  else {
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _local_6c = in_EDX;
    while( true ) {
      local_e8 = (undefined1  [8])local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"Expected parameter name.","");
      expect(this_00,IDENTIFIER,(string *)local_e8);
      if (local_e8 != (undefined1  [8])local_d8) {
        operator_delete((void *)local_e8,local_d8._0_8_ + 1);
      }
      local_e8._0_4_ = (this_00->m_previous).type;
      _Stack_e0._M_p = local_d8 + 8;
      pcVar3 = (this_00->m_previous).lexeme._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_e0,pcVar3,pcVar3 + (this_00->m_previous).lexeme._M_string_length)
      ;
      local_bc = (this_00->m_previous).col;
      local_c0 = *plVar1;
      local_a8._0_8_ = &local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"Expected parameter typename.","");
      expectTypenamePrecFunction((Parser *)local_b8,(string *)this_00,SUB81((string *)local_a8,0));
      std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::
      emplace_back<enact::FunctionStmt::Param>(&local_88,(Param *)local_e8);
      if ((Typename *)local_b8._0_8_ != (Typename *)0x0) {
        (*(*(_func_int ***)local_b8._0_8_)[1])();
      }
      local_b8._0_8_ = (Typename *)0x0;
      if (_Stack_e0._M_p != local_d8 + 8) {
        operator_delete(_Stack_e0._M_p,local_d8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ != &local_98) {
        operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
      }
      if ((this_00->m_current).type != COMMA) break;
      advance(this_00);
    }
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Expected end of parameter list.","");
    expect(this_00,RIGHT_PAREN,(string *)local_e8);
    cVar11 = local_6c;
    if (local_e8 != (undefined1  [8])local_d8) {
      operator_delete((void *)local_e8,local_d8._0_8_ + 1);
    }
  }
  local_e8 = (undefined1  [8])local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Expected return typename.","")
  ;
  expectTypenamePrecUnary((Parser *)(local_b8 + 8),(string *)this_00,SUB81(local_e8,0));
  if (local_e8 != (undefined1  [8])local_d8) {
    operator_delete((void *)local_e8,local_d8._0_8_ + 1);
  }
  if ((cVar11 == '\0') && ((this_00->m_current).type == SEMICOLON)) {
    local_a8._0_8_ = (CompileContext *)0x0;
    local_a8._8_8_ = 0;
    local_98._0_8_ = 0;
    puVar7 = (undefined8 *)operator_new(0x38);
    local_e8._0_4_ = (this_00->m_previous).type;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d8 + 8);
    pcVar3 = (this_00->m_previous).lexeme._M_dataplus._M_p;
    _Stack_e0._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_e0,pcVar3,pcVar3 + (this_00->m_previous).lexeme._M_string_length);
    local_bc = (this_00->m_previous).col;
    local_c0 = *plVar1;
    *puVar7 = &PTR__UnitExpr_00128f88;
    *(undefined4 *)(puVar7 + 1) = local_e8._0_4_;
    puVar7[2] = puVar7 + 4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_e0._M_p == paVar2) {
      puVar7[4] = local_d8._8_8_;
      puVar7[5] = local_d8._16_8_;
    }
    else {
      puVar7[2] = _Stack_e0._M_p;
      puVar7[4] = local_d8._8_8_;
    }
    puVar7[3] = local_d8._0_8_;
    local_d8._0_8_ = 0;
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    *(col_t *)((long)puVar7 + 0x34) = (this_00->m_previous).col;
    *(line_t *)(puVar7 + 6) = *plVar1;
    _Stack_e0._M_p = (pointer)paVar2;
    puVar9 = (undefined8 *)operator_new(0x28);
    uVar6 = local_98._0_8_;
    uVar5 = local_a8._8_8_;
    uVar4 = local_a8._0_8_;
    local_a8._0_8_ = (CompileContext *)0x0;
    local_a8._8_8_ = 0;
    local_98._0_8_ = 0;
    *puVar9 = &PTR__BlockExpr_00128fe0;
    puVar9[1] = uVar4;
    puVar9[2] = uVar5;
    puVar9[3] = uVar6;
    local_d8._0_8_ = 0;
    local_e8 = (undefined1  [8])0x0;
    _Stack_e0._M_p = (pointer)0x0;
    puVar9[4] = puVar7;
    std::
    vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
               *)local_e8);
    puVar7 = (undefined8 *)operator_new(0x60);
    local_e8._0_4_ = local_68;
    _Stack_e0._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_e0,local_60._M_allocated_capacity,
               (_func_int *)(local_60._8_8_ + local_60._M_allocated_capacity));
    _Var10._M_head_impl = (Stmt *)local_38;
    uVar4 = local_b8._8_8_;
    local_bc = local_3c;
    local_c0 = local_40;
    local_b8._8_8_ = (long *)0x0;
    *puVar7 = &PTR__FunctionStmt_00129028;
    *(undefined4 *)(puVar7 + 1) = local_e8._0_4_;
    puVar7[2] = puVar7 + 4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_e0._M_p == paVar2) {
      puVar7[4] = local_d8._8_8_;
      puVar7[5] = local_d8._16_8_;
    }
    else {
      puVar7[2] = _Stack_e0._M_p;
      puVar7[4] = local_d8._8_8_;
    }
    puVar7[3] = local_d8._0_8_;
    local_d8._0_8_ = 0;
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    *(col_t *)((long)puVar7 + 0x34) = local_3c;
    *(line_t *)(puVar7 + 6) = local_40;
    puVar7[7] = uVar4;
    puVar7[8] = local_88.
                super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                ._M_impl.super__Vector_impl_data._M_start;
    puVar7[9] = local_88.
                super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    puVar7[10] = local_88.
                 super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar7[0xb] = puVar9;
    *local_38._M_head_impl = (Stmt)puVar7;
    _Stack_e0._M_p = (pointer)paVar2;
    std::
    vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
               *)local_a8);
  }
  else {
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Expected \'{\' or \'=>\' before function body.","");
    expectBlock((Parser *)local_a8,(string *)this_00);
    if (local_e8 != (undefined1  [8])local_d8) {
      operator_delete((void *)local_e8,local_d8._0_8_ + 1);
    }
    pp_Var8 = (_func_int **)operator_new(0x60);
    uVar6 = local_60._8_8_;
    uVar5 = local_a8._0_8_;
    uVar4 = local_b8._8_8_;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d8 + 8);
    local_e8._0_4_ = local_68;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_allocated_capacity == &local_50) {
      local_d8._16_8_ = local_50._8_8_;
      _Stack_e0._M_p = (pointer)paVar2;
    }
    else {
      _Stack_e0._M_p = (pointer)local_60._M_allocated_capacity;
    }
    local_d8._9_7_ = local_50._1_7_;
    local_d8[8] = local_50._M_local_buf[0];
    local_60._8_8_ = (_func_int *)0x0;
    local_50._M_local_buf[0] = '\0';
    local_c0 = local_40;
    local_bc = local_3c;
    local_b8._8_8_ = (long *)0x0;
    local_a8._0_8_ = (CompileContext *)0x0;
    *pp_Var8 = (_func_int *)&PTR__FunctionStmt_00129028;
    *(TokenType *)(pp_Var8 + 1) = local_68;
    pp_Var8[2] = (_func_int *)(pp_Var8 + 4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_e0._M_p == paVar2) {
      pp_Var8[4] = (_func_int *)local_d8._8_8_;
      pp_Var8[5] = (_func_int *)local_d8._16_8_;
    }
    else {
      pp_Var8[2] = (_func_int *)_Stack_e0._M_p;
      pp_Var8[4] = (_func_int *)local_d8._8_8_;
    }
    pp_Var8[3] = (_func_int *)uVar6;
    local_d8._0_8_ = 0;
    local_d8._8_8_ = (ulong)(uint7)local_50._1_7_ << 8;
    *(col_t *)((long)pp_Var8 + 0x34) = local_3c;
    *(line_t *)(pp_Var8 + 6) = local_40;
    pp_Var8[7] = (_func_int *)uVar4;
    pp_Var8[8] = (_func_int *)
                 local_88.
                 super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pp_Var8[9] = (_func_int *)
                 local_88.
                 super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pp_Var8[10] = (_func_int *)
                  local_88.
                  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pp_Var8[0xb] = (_func_int *)uVar5;
    (local_38._M_head_impl)->_vptr_Stmt = pp_Var8;
    _Var10._M_head_impl = local_38._M_head_impl;
    _Stack_e0._M_p = (pointer)paVar2;
    local_60._M_allocated_capacity = (size_type)&local_50;
  }
  if ((long *)local_b8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_b8._8_8_ + 8))();
  }
  std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::~vector
            (&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_allocated_capacity != &local_50) {
    operator_delete((void *)local_60._M_allocated_capacity,
                    CONCAT71(local_50._1_7_,local_50._M_local_buf[0]) + 1);
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_>)_Var10._M_head_impl;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseFunctionStmt(bool mustParseBody) {
        expect(TokenType::IDENTIFIER, "Expected function name.");
        Token name = m_previous;

        expect(TokenType::LEFT_PAREN, "Expected '(' after function name.");

        std::vector<FunctionStmt::Param> params;
        if (!consume(TokenType::RIGHT_PAREN)) {
            do {
                expect(TokenType::IDENTIFIER, "Expected parameter name.");
                params.push_back(FunctionStmt::Param{m_previous, expectTypename("Expected parameter typename.")});
            } while (consume(TokenType::COMMA));

            expect(TokenType::RIGHT_PAREN, "Expected end of parameter list.");
        }

        // Get the return type
        // At second-lowest precedence to force grouping of function types (because of => ambiguity)
        std::unique_ptr<const Typename> returnTypename =
                expectTypenamePrecUnary("Expected return typename.", true);

        if (!mustParseBody && check(TokenType::SEMICOLON)) {
            return std::make_unique<FunctionStmt>(name,
                                                  std::move(returnTypename),
                                                  std::move(params),
                                                  std::make_unique<BlockExpr>(std::vector<std::unique_ptr<Stmt>>{},
                                                                              std::make_unique<UnitExpr>(m_previous)));
        }

        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before function body.");
        return std::make_unique<FunctionStmt>(std::move(name), std::move(returnTypename), std::move(params), std::move(body));
    }